

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_test.cpp
# Opt level: O2

void TestLogicalOperationNode(void)

{
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  long lVar4;
  initializer_list<std::pair<const_bool,_std::shared_ptr<Node>_>_> __l;
  bool value_two;
  bool value_one;
  bool local_120;
  bool local_11f;
  allocator<char> local_11e;
  allocator<char> local_11d;
  Date local_11c;
  int local_110;
  undefined1 local_10c [4];
  string local_108;
  LogicalOperationNode or_node;
  LogicalOperationNode and_node;
  string local_88;
  long local_68;
  map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
  bool_to_node;
  
  std::make_shared<FalseNode>();
  or_node.super_Node._vptr_Node = or_node.super_Node._vptr_Node & 0xffffffffffffff00;
  or_node._8_8_ = and_node.super_Node._vptr_Node;
  or_node.lhs_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)and_node._8_8_;
  and_node.super_Node._vptr_Node = (_func_int **)0x0;
  and_node.operation = And;
  and_node._12_4_ = 0;
  std::make_shared<EmptyNode>();
  or_node.lhs_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ = 1;
  or_node.rhs_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108._M_dataplus._M_p;
  or_node.rhs_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length;
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = 0;
  __l._M_len = 2;
  __l._M_array = (iterator)&or_node;
  std::
  map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
  ::map(&bool_to_node,__l,(less<bool> *)&local_88,(allocator_type *)&local_11c);
  lVar4 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&or_node.super_Node._vptr_Node + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&and_node.operation);
  local_10c._0_2_ = 0x100;
  lVar4 = 0;
  while (lVar4 != 2) {
    local_68 = lVar4;
    value_one = (bool)local_10c[lVar4];
    local_110 = CONCAT22(local_110._2_2_,0x100);
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      value_two = *(bool *)((long)&local_110 + lVar4);
      pmVar2 = std::
               map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
               ::operator[](&bool_to_node,&value_one);
      pmVar3 = std::
               map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
               ::operator[](&bool_to_node,&value_two);
      LogicalOperationNode::LogicalOperationNode(&or_node,Or,pmVar2,pmVar3);
      pmVar2 = std::
               map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
               ::operator[](&bool_to_node,&value_one);
      pmVar3 = std::
               map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
               ::operator[](&bool_to_node,&value_two);
      LogicalOperationNode::LogicalOperationNode(&and_node,And,pmVar2,pmVar3);
      local_11c.year = 0;
      local_11c.month = 0;
      local_11c.day = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_11d);
      local_11f = LogicalOperationNode::Evaluate(&or_node,&local_11c,&local_108);
      local_120 = value_two;
      if (value_one != false) {
        local_120 = true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"LogicalOperationNode Or",&local_11e);
      AssertEqual<bool,bool>(&local_11f,&local_120,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_108);
      local_11c.year = 0;
      local_11c.month = 0;
      local_11c.day = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_11d);
      local_11f = LogicalOperationNode::Evaluate(&and_node,&local_11c,&local_108);
      local_120 = value_two;
      if (value_one == false) {
        local_120 = (bool)0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"LogicalOperationNode And",&local_11e);
      AssertEqual<bool,bool>(&local_11f,&local_120,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_108);
      LogicalOperationNode::~LogicalOperationNode(&and_node);
      LogicalOperationNode::~LogicalOperationNode(&or_node);
    }
    lVar4 = local_68 + 1;
  }
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::shared_ptr<Node>_>,_std::_Select1st<std::pair<const_bool,_std::shared_ptr<Node>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
  ::~_Rb_tree(&bool_to_node._M_t);
  local_11c.year = 0x7e1;
  local_11c.month = 0xb;
  local_11c.day = 0x12;
  local_10c = (undefined1  [4])4;
  std::make_shared<DateComparisonNode,Comparison,Date>((Comparison *)&and_node,(Date *)local_10c);
  or_node.super_Node = and_node.super_Node;
  or_node.operation = and_node.operation;
  or_node._12_4_ = and_node._12_4_;
  and_node.super_Node._vptr_Node = (_func_int **)0x0;
  and_node.operation = And;
  and_node._12_4_ = 0;
  local_110 = 4;
  std::make_shared<EventComparisonNode,Comparison,char_const(&)[9]>
            ((Comparison *)&local_88,(char (*) [9])&local_110);
  local_108._M_dataplus._M_p = local_88._M_dataplus._M_p;
  local_108._M_string_length = local_88._M_string_length;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  LogicalOperationNode::LogicalOperationNode
            ((LogicalOperationNode *)&bool_to_node,And,(shared_ptr<Node> *)&or_node,
             (shared_ptr<Node> *)&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&or_node.operation);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&and_node.operation);
  local_108._M_dataplus._M_p = (pointer)0xb000007e1;
  local_108._M_string_length._0_4_ = 0x12;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&or_node,"Saturday",(allocator<char> *)&local_88);
  bVar1 = LogicalOperationNode::Evaluate
                    ((LogicalOperationNode *)&bool_to_node,(Date *)&local_108,(string *)&or_node);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&and_node,"LogicalOperationNode propagates arguments 1",
             (allocator<char> *)&local_11c);
  Assert(bVar1,(string *)&and_node);
  std::__cxx11::string::~string((string *)&and_node);
  std::__cxx11::string::~string((string *)&or_node);
  local_108._M_dataplus._M_p = (pointer)0xb000007e1;
  local_108._M_string_length._0_4_ = 0x12;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&or_node,"Friday",(allocator<char> *)&local_88);
  bVar1 = LogicalOperationNode::Evaluate
                    ((LogicalOperationNode *)&bool_to_node,(Date *)&local_108,(string *)&or_node);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&and_node,"LogicalOperationNode propagates arguments 2",
             (allocator<char> *)&local_11c);
  Assert(!bVar1,(string *)&and_node);
  std::__cxx11::string::~string((string *)&and_node);
  std::__cxx11::string::~string((string *)&or_node);
  local_108._M_dataplus._M_p = (pointer)0xb000007e1;
  local_108._M_string_length = CONCAT44(local_108._M_string_length._4_4_,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&or_node,"Saturday",(allocator<char> *)&local_88);
  bVar1 = LogicalOperationNode::Evaluate
                    ((LogicalOperationNode *)&bool_to_node,(Date *)&local_108,(string *)&or_node);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&and_node,"LogicalOperationNode propagates arguments 1",
             (allocator<char> *)&local_11c);
  Assert(!bVar1,(string *)&and_node);
  std::__cxx11::string::~string((string *)&and_node);
  std::__cxx11::string::~string((string *)&or_node);
  LogicalOperationNode::~LogicalOperationNode((LogicalOperationNode *)&bool_to_node);
  return;
}

Assistant:

void TestLogicalOperationNode() {
    {
        map<bool, shared_ptr<Node>> bool_to_node = {
                {false, make_shared<FalseNode>()},
                {true,  make_shared<EmptyNode>()}
        };

        for (bool value_one : {false, true}) {
            for (bool value_two : {false, true}) {
                LogicalOperationNode or_node(
                        LogicalOperation::Or, bool_to_node[value_one], bool_to_node[value_two]
                );
                LogicalOperationNode and_node(
                        LogicalOperation::And, bool_to_node[value_one], bool_to_node[value_two]
                );

                AssertEqual(or_node.Evaluate({}, ""), value_one || value_two, "LogicalOperationNode Or");
                AssertEqual(and_node.Evaluate({}, ""), value_one && value_two, "LogicalOperationNode And");
            }
        }
    }
    {
        LogicalOperationNode root(
                LogicalOperation::And,
                make_shared<DateComparisonNode>(Comparison::Equal, Date{2017, 11, 18}),
                make_shared<EventComparisonNode>(Comparison::Equal, "Saturday")
        );

        Assert(root.Evaluate({2017, 11, 18}, "Saturday"), "LogicalOperationNode propagates arguments 1");
        Assert(!root.Evaluate({2017, 11, 18}, "Friday"), "LogicalOperationNode propagates arguments 2");
        Assert(!root.Evaluate({2017, 11, 1}, "Saturday"), "LogicalOperationNode propagates arguments 1");
    }
}